

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O1

long __thiscall
cubeb_resampler_speex<short,_delay_line<short>,_cubeb_resampler_speex_one_way<short>_>::
fill_internal_output
          (cubeb_resampler_speex<short,_delay_line<short>,_cubeb_resampler_speex_one_way<short>_>
           *this,short *input_buffer,long *input_frames_count,short *output_buffer,
          long output_frames_needed)

{
  cubeb_resampler_speex_one_way<short> *pcVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  
  if (this->draining == false) {
    pcVar1 = (this->output_processor)._M_t.
             super___uniq_ptr_impl<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<short>_*,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
             .super__Head_base<0UL,_cubeb_resampler_speex_one_way<short>_*,_false>._M_head_impl;
    uVar2 = (pcVar1->resampling_in_buffer).length_;
    uVar6 = (ulong)(pcVar1->super_processor).channels;
    uVar5 = 0;
    fVar7 = (float)((int)output_frames_needed - (int)(uVar2 / uVar6)) * pcVar1->resampling_ratio -
            (float)(int)((pcVar1->resampling_out_buffer).length_ / uVar6);
    if (0.0 <= fVar7) {
      fVar7 = ceilf(fVar7);
      uVar5 = (long)fVar7 & 0xffffffff;
    }
    pcVar1->leftover_samples = (uint32_t)uVar2;
    auto_array<short>::reserve(&pcVar1->resampling_in_buffer,uVar6 * uVar5 + (uVar2 & 0xffffffff));
    lVar3 = (*this->data_callback)
                      (this->stream,this->user_ptr,(void *)0x0,
                       (pcVar1->resampling_in_buffer).data_ + pcVar1->leftover_samples,uVar5);
    if ((lVar3 < (long)uVar5) && (this->draining = true, lVar3 < 0)) {
      return lVar3;
    }
    pcVar1 = (this->output_processor)._M_t.
             super___uniq_ptr_impl<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<short>_*,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
             .super__Head_base<0UL,_cubeb_resampler_speex_one_way<short>_*,_false>._M_head_impl;
    (pcVar1->resampling_in_buffer).length_ =
         lVar3 * (ulong)(pcVar1->super_processor).channels + (ulong)pcVar1->leftover_samples;
  }
  sVar4 = cubeb_resampler_speex_one_way<short>::output
                    ((this->output_processor)._M_t.
                     super___uniq_ptr_impl<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<short>_*,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                     .super__Head_base<0UL,_cubeb_resampler_speex_one_way<short>_*,_false>.
                     _M_head_impl,output_buffer,output_frames_needed);
  return sVar4;
}

Assistant:

long
cubeb_resampler_speex<T, InputProcessor, OutputProcessor>::fill_internal_output(
    T * input_buffer, long * input_frames_count, T * output_buffer,
    long output_frames_needed)
{
  assert(!input_buffer && (!input_frames_count || *input_frames_count == 0) &&
         output_buffer && output_frames_needed);

  if (!draining) {
    long got = 0;
    T * out_unprocessed = nullptr;
    long output_frames_before_processing = 0;

    /* fill directly the input buffer of the output processor to save a copy */
    output_frames_before_processing =
        output_processor->input_needed_for_output(output_frames_needed);

    out_unprocessed =
        output_processor->input_buffer(output_frames_before_processing);

    got = data_callback(stream, user_ptr, nullptr, out_unprocessed,
                        output_frames_before_processing);

    if (got < output_frames_before_processing) {
      draining = true;

      if (got < 0) {
        return got;
      }
    }

    output_processor->written(got);
  }

  /* Process the output. If not enough frames have been returned from the
   * callback, drain the processors. */
  return output_processor->output(output_buffer, output_frames_needed);
}